

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

void __thiscall QUnsortedModelEngine::filterOnDemand(QUnsortedModelEngine *this,int n)

{
  QModelIndex *m;
  QString *pQVar1;
  long lVar2;
  char16_t *pcVar3;
  QString part;
  int iVar4;
  int iVar5;
  long *plVar6;
  int *piVar7;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff88;
  QArrayData *pQVar8;
  QIndexMapper local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QCompletionEngine).curMatch.partial == true) {
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    m = &(this->super_QCompletionEngine).curParent;
    iVar4 = (**(code **)(*plVar6 + 0x78))(plVar6,m);
    piVar7 = &(this->super_QCompletionEngine).curMatch.indices.t;
    if ((this->super_QCompletionEngine).curMatch.indices.v != false) {
      piVar7 = (this->super_QCompletionEngine).curMatch.indices.vector.d.ptr +
               (this->super_QCompletionEngine).curMatch.indices.vector.d.size + -1;
    }
    local_58.f = *piVar7 + 1;
    local_58.v = false;
    local_58._1_7_ = 0xaaaaaaaaaaaaaa;
    local_58.vector.d.d = (Data *)0x0;
    local_58.vector.d.ptr = (int *)0x0;
    local_58.vector.d.size = 0;
    local_58.t = iVar4 + -1;
    iVar5 = buildIndices(this,(this->super_QCompletionEngine).curParts.d.ptr +
                              (this->super_QCompletionEngine).curParts.d.size + -1,m,n,&local_58,
                         &(this->super_QCompletionEngine).curMatch);
    (this->super_QCompletionEngine).curMatch.partial = iVar4 + -1 != iVar5;
    pQVar1 = (this->super_QCompletionEngine).curParts.d.ptr;
    lVar2 = (this->super_QCompletionEngine).curParts.d.size;
    pQVar8 = &(pQVar1[lVar2 + -1].d.d)->super_QArrayData;
    pcVar3 = pQVar1[lVar2 + -1].d.ptr;
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    part.d.ptr = (char16_t *)pQVar8;
    part.d.d = (Data *)in_stack_ffffffffffffff88;
    part.d.size = (qsizetype)pcVar3;
    QCompletionEngine::saveInCache
              (&this->super_QCompletionEngine,part,(QModelIndex *)&stack0xffffffffffffff90,
               (QMatchData *)m);
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar8,2,0x10);
      }
    }
    if (&(local_58.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_58.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_58.vector.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnsortedModelEngine::filterOnDemand(int n)
{
    Q_ASSERT(matchCount());
    if (!curMatch.partial)
        return;
    Q_ASSERT(n >= -1);
    const QAbstractItemModel *model = c->proxy->sourceModel();
    int lastRow = model->rowCount(curParent) - 1;
    QIndexMapper im(curMatch.indices.last() + 1, lastRow);
    int lastIndex = buildIndices(curParts.constLast(), curParent, n, im, &curMatch);
    curMatch.partial = (lastRow != lastIndex);
    saveInCache(curParts.constLast(), curParent, curMatch);
}